

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qetag.c
# Opt level: O1

Qiniu_Error Qiniu_Qetag_mergeBlocks(_Qiniu_Qetag_Context *ctx)

{
  undefined1 *puVar1;
  undefined2 uVar2;
  ushort uVar3;
  Qiniu_Crypto_Result QVar4;
  undefined8 uVar5;
  char *pcVar6;
  Qiniu_Error QVar7;
  uchar digest [20];
  uchar auStack_48 [24];
  
  pcVar6 = "ok";
  uVar5 = 200;
  if (ctx->blkUnused < ctx->blkElementCount) {
    do {
      uVar3 = ctx->blkBegin;
      if ((ctx->blkArray[uVar3].field_0.field_0x2 & 0x80) == 0) break;
      QVar4 = Qiniu_Digest_Final(ctx->blkArray[uVar3].sha1Digest,auStack_48,(size_t *)0x0);
      if ((QVar4 != QINIU_CRYPTO_RESULT_OK) ||
         (QVar4 = Qiniu_Digest_Update(ctx->sha1Digest,auStack_48,0x14),
         QVar4 != QINIU_CRYPTO_RESULT_OK)) {
        uVar5 = 9999;
        pcVar6 = "openssl internal error";
        goto LAB_0011439c;
      }
      puVar1 = &ctx->blkArray[uVar3].field_0.field_0x2;
      *puVar1 = *puVar1 & 0x7f;
      uVar2 = ctx->blkBegin;
      uVar3 = uVar2 + 1;
      if (ctx->blkElementCount <= uVar3) {
        uVar3 = 0;
      }
      ctx->blkBegin = uVar3;
      uVar3 = ctx->blkUnused + 1;
      ctx->blkUnused = uVar3;
    } while (uVar3 < ctx->blkElementCount);
    uVar5 = 200;
  }
LAB_0011439c:
  QVar7.message = pcVar6;
  QVar7._0_8_ = uVar5;
  return QVar7;
}

Assistant:

static Qiniu_Error Qiniu_Qetag_mergeBlocks(struct _Qiniu_Qetag_Context * ctx) {
    Qiniu_Error err;
    unsigned char digest[SHA_DIGEST_LENGTH];
    struct _Qiniu_Qetag_Block * blk = NULL;

    while (ctx->blkUnused < ctx->blkElementCount && ctx->blkArray[ctx->blkBegin].done == YES) {
        blk = &ctx->blkArray[ctx->blkBegin];

		if (Qiniu_Digest_Final(blk->sha1Digest, digest, NULL) != QINIU_CRYPTO_RESULT_OK) {
			err.code = 9999;
			err.message = "openssl internal error";
			return err;
		}

		if (Qiniu_Digest_Update(ctx->sha1Digest, digest, sizeof(digest)) != QINIU_CRYPTO_RESULT_OK) {
			err.code = 9999;
			err.message = "openssl internal error";
			return err;
		}

        blk->done = NO;

        ctx->blkBegin += 1;
        if (ctx->blkBegin >= ctx->blkElementCount) {
            ctx->blkBegin = 0;
        }
        ctx->blkUnused += 1;
    } // while

    err.code = 200;
    err.message = "ok";
    return err;
}